

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteModule
          (BinaryWriterSpec *this,string_view filename,Module *module)

{
  Result RVar1;
  Stream *stream;
  string_view local_28;
  
  local_28.size_ = filename.size_;
  local_28.data_ = filename.data_;
  if ((this->module_stream_factory_).super__Function_base._M_manager != (_Manager_type)0x0) {
    stream = (*(this->module_stream_factory_)._M_invoker)
                       ((_Any_data *)&this->module_stream_factory_,&local_28);
    RVar1 = WriteBinaryModule(stream,module,this->options_);
    (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void BinaryWriterSpec::WriteModule(string_view filename, const Module& module) {
  result_ |=
      WriteBinaryModule(module_stream_factory_(filename), &module, options_);
}